

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors,bool pColorPerVertex)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  size_t i;
  aiColor4D *paVar6;
  ulong uVar7;
  runtime_error *prVar8;
  long *plVar9;
  undefined7 in_register_00000009;
  size_type *psVar10;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  _Self __tmp;
  _List_node_base *p_Var14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var14 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  uVar7 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
          _M_node._M_size;
  if ((int)CONCAT71(in_register_00000009,pColorPerVertex) == 0) {
    uVar2 = pMesh->mNumFaces;
    uVar13 = (ulong)uVar2;
    if (uVar7 < uVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_b0,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_70,"MeshGeometry_AddColor1. Colors count(",&local_b0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_f0._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_f0._M_dataplus._M_p == psVar10) {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0.field_2._8_8_ = plVar9[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_f0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      to_string<unsigned_int>(&local_90,pMesh->mNumFaces);
      std::operator+(&local_50,&local_f0,&local_90);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0 = (long *)*plVar9;
      plVar11 = plVar9 + 2;
      if (local_d0 == plVar11) {
        local_c0 = *plVar11;
        lStack_b8 = plVar9[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar11;
      }
      local_c8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar8,(string *)&local_d0);
      *(undefined ***)prVar8 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = pMesh->mNumVertices;
    uVar7 = (ulong)uVar3 << 4;
    paVar6 = (aiColor4D *)operator_new__(uVar7);
    if ((ulong)uVar3 != 0) {
      memset(paVar6,0,uVar7);
    }
    pMesh->mColors[0] = paVar6;
    if (uVar2 != 0) {
      uVar7 = 0;
      do {
        uVar12 = (ulong)pMesh->mFaces[uVar7].mNumIndices;
        if (uVar12 != 0) {
          uVar13 = 0;
          do {
            paVar6 = pMesh->mColors[0];
            uVar2 = pMesh->mFaces[uVar7].mIndices[uVar13];
            p_Var5 = p_Var14[1]._M_prev;
            *(_List_node_base **)(paVar6 + uVar2) = p_Var14[1]._M_next;
            *(_List_node_base **)&paVar6[uVar2].b = p_Var5;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
          uVar13 = (ulong)pMesh->mNumFaces;
        }
        p_Var14 = p_Var14->_M_next;
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar13);
    }
  }
  else {
    uVar13 = (ulong)pMesh->mNumVertices;
    if (uVar7 < uVar13) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_b0,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_70,"MeshGeometry_AddColor1. Colors count(",&local_b0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_f0._M_dataplus._M_p = (pointer)*plVar9;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_f0._M_dataplus._M_p == psVar10) {
        local_f0.field_2._M_allocated_capacity = *psVar10;
        local_f0.field_2._8_8_ = plVar9[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_f0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      to_string<unsigned_int>(&local_90,pMesh->mNumVertices);
      std::operator+(&local_50,&local_f0,&local_90);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_d0 = (long *)*plVar9;
      plVar11 = plVar9 + 2;
      if (local_d0 == plVar11) {
        local_c0 = *plVar11;
        lStack_b8 = plVar9[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar11;
      }
      local_c8 = plVar9[1];
      *plVar9 = (long)plVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar8,(string *)&local_d0);
      *(undefined ***)prVar8 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar6 = (aiColor4D *)operator_new__(uVar13 << 4);
    if (uVar13 == 0) {
      pMesh->mColors[0] = paVar6;
    }
    else {
      lVar15 = 0;
      memset(paVar6,0,uVar13 << 4);
      pMesh->mColors[0] = paVar6;
      uVar7 = 0;
      do {
        p_Var5 = p_Var14 + 1;
        p_Var4 = p_Var14[1]._M_prev;
        p_Var14 = p_Var14->_M_next;
        puVar1 = (undefined8 *)((long)&pMesh->mColors[0]->r + lVar15);
        *puVar1 = p_Var5->_M_next;
        puVar1[1] = p_Var4;
        uVar7 = uVar7 + 1;
        lVar15 = lVar15 + 0x10;
      } while (uVar7 < pMesh->mNumVertices);
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::list<aiColor4D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D>::const_iterator col_it = pColors.begin();

	if(pColorPerVertex)
	{
		if(pColors.size() < pMesh.mNumVertices)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Vertices count(" +
									to_string(pMesh.mNumVertices) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mColors[0][i] = *col_it++;
	}// if(pColorPerVertex)
	else
	{
		if(pColors.size() < pMesh.mNumFaces)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Faces count(" +
									to_string(pMesh.mNumFaces) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
            for ( size_t vi = 0, vi_e = pMesh.mFaces[ fi ].mNumIndices; vi < vi_e; vi++ )
            {
                pMesh.mColors[ 0 ][ pMesh.mFaces[ fi ].mIndices[ vi ] ] = *col_it;
            }

			++col_it;
		}
	}// if(pColorPerVertex) else
}